

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageLoadStoreTests.cpp
# Opt level: O1

TestInstance * __thiscall
vkt::image::anon_unknown_0::StoreTest::createInstance(StoreTest *this,Context *context)

{
  StoreTestInstance *this_00;
  Texture *this_01;
  int *this_02;
  int iVar1;
  long lVar2;
  long lVar3;
  StoreTestInstance *this_03;
  InstanceInterface *vki;
  VkPhysicalDevice physDevice;
  VkDeviceSize VVar4;
  DeviceInterface *vk;
  VkDevice device;
  Allocator *allocator;
  Image *this_04;
  Buffer *this_05;
  long lVar5;
  undefined4 *__s;
  UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> local_a8;
  undefined1 *local_98;
  int *local_90;
  VkImageCreateInfo local_88;
  
  if ((this->m_texture).m_type == IMAGE_TYPE_BUFFER) {
    this_03 = (StoreTestInstance *)operator_new(200);
    StoreTestInstance::StoreTestInstance
              (this_03,context,&this->m_texture,this->m_format,this->m_declareImageFormatInShader,
               false);
    (this_03->super_BaseTestInstance).super_TestInstance._vptr_TestInstance =
         (_func_int **)&PTR__BufferStoreTestInstance_00d621b8;
    this_03[1].super_BaseTestInstance.super_TestInstance._vptr_TestInstance = (_func_int **)0x0;
    this_03[1].super_BaseTestInstance.super_TestInstance.m_context = (Context *)0x0;
    this_03[1].super_BaseTestInstance.m_texture.m_layerSize.m_data[0] = 0;
    this_03[1].super_BaseTestInstance.m_texture.m_layerSize.m_data[1] = 0;
    *(undefined8 *)(this_03[1].super_BaseTestInstance.m_texture.m_layerSize.m_data + 2) = 0;
    this_03[1].super_BaseTestInstance.m_texture.m_numLayers = 0;
    this_03[1].super_BaseTestInstance.m_texture.m_numSamples = 0;
    this_03[1].super_BaseTestInstance.m_format = VK_FORMAT_UNDEFINED;
    this_03[1].super_BaseTestInstance.m_declareImageFormatInShader = false;
    this_03[1].super_BaseTestInstance.m_singleLayerBind = false;
    *(undefined2 *)&this_03[1].super_BaseTestInstance.field_0x2e = 0;
    this_03[1].m_imageBuffer.
    super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>.m_data.ptr =
         (Buffer *)0x0;
    *(undefined8 *)
     &this_03[1].m_imageBuffer.
      super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>.m_data.field_0x8
         = 0;
    this_03[1].m_imageSizeBytes = 0;
    this_03[2].super_BaseTestInstance.super_TestInstance._vptr_TestInstance = (_func_int **)0x0;
    this_03[2].super_BaseTestInstance.super_TestInstance.m_context = (Context *)0x0;
    this_03[2].super_BaseTestInstance.m_texture.m_layerSize.m_data[0] = 0;
    this_03[2].super_BaseTestInstance.m_texture.m_layerSize.m_data[1] = 0;
    *(undefined8 *)(this_03[2].super_BaseTestInstance.m_texture.m_layerSize.m_data + 2) = 0;
    this_03[2].super_BaseTestInstance.m_texture.m_numLayers = 0;
    this_03[2].super_BaseTestInstance.m_texture.m_numSamples = 0;
    this_03[2].super_BaseTestInstance.m_format = VK_FORMAT_UNDEFINED;
    this_03[2].super_BaseTestInstance.m_declareImageFormatInShader = false;
    this_03[2].super_BaseTestInstance.m_singleLayerBind = false;
    *(undefined2 *)&this_03[2].super_BaseTestInstance.field_0x2e = 0;
    this_03[2].m_imageBuffer.
    super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>.m_data.ptr =
         (Buffer *)0x0;
  }
  else {
    this_03 = (StoreTestInstance *)operator_new(0xe0);
    StoreTestInstance::StoreTestInstance
              (this_03,context,&this->m_texture,this->m_format,this->m_declareImageFormatInShader,
               this->m_singleLayerBind);
    (this_03->super_BaseTestInstance).super_TestInstance._vptr_TestInstance =
         (_func_int **)&PTR__ImageStoreTestInstance_00d62320;
    this_00 = this_03 + 1;
    this_03[1].super_BaseTestInstance.super_TestInstance._vptr_TestInstance = (_func_int **)0x0;
    this_01 = &this_03[1].super_BaseTestInstance.m_texture;
    this_03[1].super_BaseTestInstance.m_texture.m_layerSize.m_data[0] = 0;
    this_03[1].super_BaseTestInstance.m_texture.m_layerSize.m_data[1] = 0;
    vki = Context::getInstanceInterface(context);
    physDevice = Context::getPhysicalDevice(context);
    VVar4 = getOptimalUniformBufferChunkSize(vki,physDevice,4);
    this_03[1].super_BaseTestInstance.m_texture.m_numLayers = (int)VVar4;
    this_03[1].super_BaseTestInstance.m_texture.m_numSamples = (int)(VVar4 >> 0x20);
    this_02 = &this_03[2].super_BaseTestInstance.m_texture.m_numLayers;
    this_03[1].super_BaseTestInstance.m_format = VK_FORMAT_UNDEFINED;
    this_03[1].super_BaseTestInstance.m_declareImageFormatInShader = false;
    this_03[1].super_BaseTestInstance.m_singleLayerBind = false;
    *(undefined2 *)&this_03[1].super_BaseTestInstance.field_0x2e = 0;
    this_03[1].m_imageBuffer.
    super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>.m_data.ptr =
         (Buffer *)0x0;
    *(undefined8 *)
     &this_03[1].m_imageBuffer.
      super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>.m_data.field_0x8
         = 0;
    this_03[1].m_imageSizeBytes = 0;
    this_03[2].super_BaseTestInstance.super_TestInstance._vptr_TestInstance = (_func_int **)0x0;
    this_03[2].super_BaseTestInstance.super_TestInstance.m_context = (Context *)0x0;
    this_03[2].super_BaseTestInstance.m_texture.m_layerSize.m_data[0] = 0;
    this_03[2].super_BaseTestInstance.m_texture.m_layerSize.m_data[1] = 0;
    *(undefined8 *)(this_03[2].super_BaseTestInstance.m_texture.m_layerSize.m_data + 2) = 0;
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
    ::vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
              *)this_02,(long)(this->m_texture).m_numLayers,(allocator_type *)&local_88);
    local_98 = &this_03[2].m_imageBuffer.
                super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>.m_data
                .field_0x8;
    local_90 = this_02;
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
    ::vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
              *)local_98,(long)(this->m_texture).m_numLayers,(allocator_type *)&local_88);
    vk = Context::getDeviceInterface((this_03->super_BaseTestInstance).super_TestInstance.m_context)
    ;
    device = Context::getDevice((this_03->super_BaseTestInstance).super_TestInstance.m_context);
    allocator = Context::getDefaultAllocator
                          ((this_03->super_BaseTestInstance).super_TestInstance.m_context);
    this_04 = (Image *)operator_new(0x30);
    makeImageCreateInfo(&local_88,&(this_03->super_BaseTestInstance).m_texture,
                        (this_03->super_BaseTestInstance).m_format,9,0);
    Image::Image(this_04,vk,device,allocator,&local_88,(MemoryRequirement)0x0);
    local_a8.m_data.ptr = (Buffer *)0x0;
    if ((Image *)(this_00->super_BaseTestInstance).super_TestInstance._vptr_TestInstance != this_04)
    {
      de::details::UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>::reset
                ((UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_> *)this_00);
      (this_00->super_BaseTestInstance).super_TestInstance._vptr_TestInstance =
           (_func_int **)this_04;
    }
    de::details::UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>::reset
              ((UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_> *)&local_a8);
    iVar1 = (this_03->super_BaseTestInstance).m_texture.m_numLayers;
    VVar4 = *(long *)&this_03[1].super_BaseTestInstance.m_texture.m_numLayers * (long)iVar1;
    this_05 = (Buffer *)operator_new(0x30);
    makeBufferCreateInfo((VkBufferCreateInfo *)&local_88,VVar4,0x10);
    image::Buffer::Buffer
              (this_05,vk,device,allocator,(VkBufferCreateInfo *)&local_88,(MemoryRequirement)0x1);
    local_a8.m_data.ptr = (Buffer *)0x0;
    if (*(Buffer **)(this_01->m_layerSize).m_data != this_05) {
      de::details::UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::reset
                ((UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> *)this_01)
      ;
      *(Buffer **)(this_01->m_layerSize).m_data = this_05;
    }
    de::details::UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::reset
              (&local_a8);
    lVar2 = **(long **)(this_01->m_layerSize).m_data;
    __s = *(undefined4 **)(lVar2 + 0x18);
    memset(__s,0,VVar4);
    if (0 < iVar1) {
      lVar3 = *(long *)&this_03[1].super_BaseTestInstance.m_texture.m_numLayers;
      lVar5 = 0;
      do {
        *__s = (int)lVar5;
        lVar5 = lVar5 + 1;
        __s = (undefined4 *)((long)__s + lVar3);
      } while (iVar1 != lVar5);
    }
    ::vk::flushMappedMemoryRange
              (vk,device,(VkDeviceMemory)*(deUint64 *)(lVar2 + 8),*(VkDeviceSize *)(lVar2 + 0x10),
               VVar4);
  }
  return (TestInstance *)this_03;
}

Assistant:

TestInstance* StoreTest::createInstance (Context& context) const
{
	if (m_texture.type() == IMAGE_TYPE_BUFFER)
		return new BufferStoreTestInstance(context, m_texture, m_format, m_declareImageFormatInShader);
	else
		return new ImageStoreTestInstance(context, m_texture, m_format, m_declareImageFormatInShader, m_singleLayerBind);
}